

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

s_level * get_first_elemental_plane(void)

{
  int iVar1;
  s_level *psVar2;
  s_level **ppsVar3;
  s_level **ppsVar4;
  
  ppsVar3 = &sp_levchn;
  do {
    ppsVar3 = &((s_level *)ppsVar3)->next->next;
    if ((s_level *)ppsVar3 == (s_level *)0x0) break;
    iVar1 = strncasecmp("dummy",((s_level *)ppsVar3)->proto,0xffffffffffffffff);
  } while (iVar1 != 0);
  ppsVar4 = &sp_levchn;
  do {
    ppsVar4 = &((s_level *)ppsVar4)->next->next;
    if ((s_level *)ppsVar4 == (s_level *)0x0) break;
    iVar1 = strncasecmp("astral",((s_level *)ppsVar4)->proto,0xffffffffffffffff);
  } while (iVar1 != 0);
  do {
    psVar2 = (s_level *)ppsVar4;
    if ((s_level *)ppsVar4 == (s_level *)0x0) {
      return psVar2;
    }
    ppsVar4 = &((s_level *)ppsVar4)->next->next;
  } while (ppsVar4 != ppsVar3);
  return psVar2;
}

Assistant:

s_level *get_first_elemental_plane(void)
{
	s_level *curr,
		*dummy = find_level("dummy");
	for (curr = find_level("astral"); curr; curr = curr->next) {
	    if (curr->next == dummy)
		return curr;
	}
	return NULL;
}